

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_test_driver.h
# Opt level: O0

bool __thiscall
libaom_test::EncoderTest::HandleDecodeResult
          (EncoderTest *this,aom_codec_err_t res_dec,Decoder *decoder)

{
  bool bVar1;
  char *message;
  AssertHelper *this_00;
  int in_ESI;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  char **in_stack_ffffffffffffff88;
  Message *in_stack_ffffffffffffff90;
  aom_codec_err_t *in_stack_ffffffffffffff98;
  Decoder *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *file;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_28;
  int local_c;
  
  local_c = in_ESI;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (aom_codec_err_t *)in_stack_ffffffffffffff90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    message = Decoder::DecodeError(in_stack_ffffffffffffffa0);
    file = message;
    testing::Message::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12ca48)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,file,in_stack_ffffffffffffffac,
               message);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x12ca96);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12cae6);
  return local_c == 0;
}

Assistant:

virtual bool HandleDecodeResult(const aom_codec_err_t res_dec,
                                  Decoder *decoder) {
    EXPECT_EQ(AOM_CODEC_OK, res_dec) << decoder->DecodeError();
    return AOM_CODEC_OK == res_dec;
  }